

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BasicReporter::EndSection(BasicReporter *this,string *sectionName,Counts *assertions)

{
  pointer pSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  Colour colour;
  Colour local_69;
  string local_68;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pSVar1 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar1[-1].emitted != true) || (pSVar1[-1].name._M_string_length == 0)) goto LAB_00131000;
  poVar4 = (this->m_config).m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[End of section: \'",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(sectionName->_M_dataplus)._M_p,sectionName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' ",2);
  if (assertions->failed == 0) {
    Colour::Colour(&local_69,BrightGreen);
    poVar4 = (this->m_config).m_stream;
    bVar7 = 1 < assertions->passed;
    pcVar5 = "";
    if (bVar7) {
      pcVar5 = "All ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,(ulong)bVar7 << 2);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)assertions->passed;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"assertion","");
    local_48 = (undefined1  [8])paVar3;
    local_40._M_p = local_38._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    poVar4 = operator<<(poVar4,(pluralise *)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," passed",7);
    if (local_40._M_p != local_38._M_local_buf + 8) {
      operator_delete(local_40._M_p);
    }
    _Var6._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_00130fb2;
  }
  else {
    Colour::Colour(&local_69,BrightRed);
    local_48 = (undefined1  [8])&local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"assertion","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"All ","");
    ReportCounts(this,(string *)local_48,assertions,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    _Var6._M_p = (pointer)local_48;
    if (local_48 != (undefined1  [8])&local_38) {
LAB_00130fb2:
      operator_delete(_Var6._M_p);
    }
  }
  Colour::~Colour(&local_69);
  poVar4 = (this->m_config).m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_00131000:
  pSVar1 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_sectionSpans).
  super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
  pcVar2 = pSVar1[-1].name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pSVar1[-1].name.field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

virtual void EndSection( const std::string& sectionName, const Counts& assertions ) {

            SpanInfo& sectionSpan = m_sectionSpans.back();
            if( sectionSpan.emitted && !sectionSpan.name.empty() ) {
                m_config.stream() << "[End of section: '" << sectionName << "' ";

                if( assertions.failed ) {
                    Colour colour( Colour::ResultError );
                    ReportCounts( "assertion", assertions);
                }
                else {
                    Colour colour( Colour::ResultSuccess );
                    m_config.stream()   << ( assertions.passed > 1 ? "All " : "" )
                                        << pluralise( assertions.passed, "assertion" ) << " passed" ;
                }
                m_config.stream() << "]\n" << std::endl;
            }
            m_sectionSpans.pop_back();
        }